

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Translate(FormattingScene *this,Float dx,Float dy,Float dz,FileLoc loc)

{
  Float local_4c;
  Float local_48;
  Float local_44;
  string local_40;
  
  local_4c = dz;
  local_48 = dy;
  local_44 = dx;
  indent_abi_cxx11_(&local_40,this,0);
  Printf<std::__cxx11::string,float&,float&,float&>
            ("%sTranslate %f %f %f\n",&local_40,&local_44,&local_48,&local_4c);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FormattingScene::Translate(Float dx, Float dy, Float dz, FileLoc loc) {
    Printf("%sTranslate %f %f %f\n", indent(), dx, dy, dz);
}